

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TailVerifying.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>::
TailVerification<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,long&>
          (TailVerification<2,njoy::ENDFtk::record::Tail> *this,int expectedValue,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *args_1,long *args_2)

{
  undefined4 *puVar1;
  array<int,_3UL> aVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  aVar2 = Tail::read<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(args,args_1);
  *(_Type *)this = aVar2._M_elems;
  *args_2 = *args_2 + 1;
  if (aVar2._M_elems[2] == expectedValue) {
    return;
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,helper::name<2>,DAT_001deb10 + helper::name<2>);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,helper::symbol<2>,DAT_001deb38 + helper::symbol<2>);
  tools::Log::error<char_const*,std::__cxx11::string,std::__cxx11::string>
            ("The record {} number ({}) is inconsistent with expectation.",&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,helper::name<2>,DAT_001deb10 + helper::name<2>);
  tools::Log::info<char_const*,std::__cxx11::string,int>
            ("The read {} number is: {}",&local_60,*(int *)(this + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,helper::name<2>,DAT_001deb10 + helper::name<2>);
  tools::Log::info<char_const*,std::__cxx11::string,int>
            ("The expected {} number is: {}",&local_40,expectedValue);
  std::__cxx11::string::~string((string *)&local_40);
  tools::Log::info<char_const*>("Error encountered while verifying record tail values");
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 8;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TailVerification( int expectedValue, Args&&... args ) :
      Tail( std::forward< Args >( args )... ) {
      if( this->fields[ position ] != expectedValue ){
        Log::error( "The record {} number ({}) is inconsistent with expectation.",
                    helper::name< position >, helper::symbol< position > );
        Log::info( "The read {} number is: {}",
                   helper::name< position >, this->fields[ position ] );
        Log::info( "The expected {} number is: {}",
                   helper::name< position >, expectedValue );
        Log::info( "Error encountered while verifying record tail values" );

        throw (position + 6);
      }
    }